

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O3

int zt_unit_main(zt_unit *unit,int argc,char **argv)

{
  char *__s1;
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (1 < argc) {
    uVar1 = (ulong)(uint)argc;
    uVar4 = 1;
    do {
      __s1 = argv[uVar4];
      if (*__s1 == '-') {
        if (((__s1[1] == 'h') && (__s1[2] == '\0')) || (iVar2 = strcmp(__s1,"--help"), iVar2 == 0))
        goto LAB_0010431d;
        if ((__s1[1] == 'l') && (__s1[2] == '\0')) goto LAB_00104339;
      }
      else {
        iVar2 = strcmp(__s1,"--help");
        if (iVar2 == 0) {
LAB_0010431d:
          printf("%s %s",*argv,
                 "[options] <suite | suite.test> ...\n\nOptions:\n     -h, --help               This help text\n     -l, --list               list suites and test (default disabled)\n"
                );
          return 0;
        }
      }
      iVar2 = strcmp(__s1,"--list");
      if (iVar2 == 0) {
LAB_00104339:
        zt_unit_list(unit);
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if (1 < argc) {
      iVar2 = 0;
      bVar6 = true;
      uVar4 = 1;
      do {
        while( true ) {
          uVar5 = uVar4 + 1;
          iVar3 = zt_unit_run_by_name(unit,argv[uVar4]);
          if (-1 < iVar3) break;
          bVar6 = false;
          printf("Suite or Test \"%s\" not found\n",argv[uVar4]);
          iVar2 = -1;
          uVar4 = uVar5;
          if (uVar5 == uVar1) {
            return -1;
          }
        }
        uVar4 = uVar5;
      } while (uVar5 != uVar1);
      if (!bVar6) {
        return iVar2;
      }
      goto LAB_00104314;
    }
  }
  zt_unit_run(unit);
LAB_00104314:
  return -(uint)(unit->failures != 0);
}

Assistant:

int
zt_unit_main(struct zt_unit    * unit,
             int argc,
             char    * argv[])
{
    int                i;
    int                result = 0;

    char * msg = "[options] <suite | suite.test> ..."NL
                ""NL
                "Options:"NL
                "     -h, --help               This help text"NL
                "     -l, --list               list suites and test (default disabled)"NL;

    for(i=1; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0 ||
           strcmp(argv[i], "--help") == 0) {
            printf("%s %s", argv[0], msg);
            return 0;
        } else if(strcmp(argv[i], "-l") == 0 ||
                  strcmp(argv[i], "--list") == 0) {
            zt_unit_list(unit);
            return 0;
        }
    }

    if (argc > 1) {
        for (i = 1; i < argc; i++) {
            if (zt_unit_run_by_name(unit, argv[i]) < 0) {
                printf("Suite or Test \"%s\" not found\n", argv[i]);
                result = -1;
            }
        }
    } else {
        if ((result = zt_unit_run(unit)) < 0) {
            return result;
        }
    }

    if (result == 0) {
        if (unit->failures > 0) {
            result = -1;
        }
    }
    return result;
}